

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O2

bool ViewImage(string *path,Range range)

{
  int cyl_step;
  bool bVar1;
  int def_cyls;
  int def_heads;
  LogHelper *pLVar2;
  shared_ptr<Disk> disk;
  Range range_local;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  range_local._8_8_ = range._8_8_;
  range_local._0_8_ = range._0_8_;
  pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [2])0x1abe0c);
  pLVar2 = util::operator<<(pLVar2,path);
  util::operator<<(pLVar2,(char (*) [3])"]\n");
  std::make_shared<Disk>();
  bVar1 = ReadImage(path,&disk,true);
  cyl_step = opt.step;
  if (bVar1) {
    def_cyls = Disk::cyls(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    def_heads = Disk::heads(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ValidateRange(&range_local,0x80,2,cyl_step,def_cyls,def_heads);
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_view.cpp:211:20)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_view.cpp:211:20)>
               ::_M_manager;
    local_38._M_unused._M_object = &disk;
    Range::each(&range_local,(function<void_(const_CylHead_&)> *)&local_38,true);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool ViewImage(const std::string& path, Range range)
{
    util::cout << "[" << path << "]\n";

    auto disk = std::make_shared<Disk>();
    if (ReadImage(path, disk))
    {
        ValidateRange(range, MAX_TRACKS, MAX_SIDES, opt.step, disk->cyls(), disk->heads());

        range.each([&](const CylHead& cylhead) {
            auto track = disk->read_track(cylhead * opt.step);
            NormaliseTrack(cylhead, track);
            ViewTrack(cylhead, track);

            if (opt.verbose)
            {
                auto trackdata = disk->read(cylhead * opt.step);
                auto bitbuf = trackdata.preferred().bitstream();
                NormaliseBitstream(bitbuf);
                auto encoding = (opt.encoding == Encoding::Unknown) ?
                    bitbuf.encoding : opt.encoding;

                switch (encoding)
                {
                case Encoding::MFM:
                case Encoding::Amiga:
                case Encoding::Agat:
                case Encoding::MX:
                    ViewTrack_MFM_FM(Encoding::MFM, bitbuf);
                    break;
                case Encoding::FM:
                case Encoding::RX02:
                    ViewTrack_MFM_FM(Encoding::FM, bitbuf);
                    break;
                default:
                    throw util::exception("unsupported track view encoding");
                }
            }
            }, true);
    }

    return true;
}